

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O1

HighsInt Highs_passRowName(void *highs,HighsInt row,char *name)

{
  HighsStatus HVar1;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,name,&local_39);
  HVar1 = Highs::passRowName((Highs *)highs,row,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return HVar1;
}

Assistant:

HighsInt Highs_passRowName(const void* highs, const HighsInt row,
                           const char* name) {
  return (HighsInt)((Highs*)highs)->passRowName(row, std::string(name));
}